

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool Jupiter::Database::append(char *file,DataBuffer *data)

{
  FILE *__stream;
  bool r;
  FILE *f;
  DataBuffer *data_local;
  char *file_local;
  
  __stream = fopen(file,"ab");
  if (__stream == (FILE *)0x0) {
    file_local._7_1_ = false;
  }
  else {
    file_local._7_1_ = append((FILE *)__stream,data);
    fclose(__stream);
  }
  return file_local._7_1_;
}

Assistant:

bool Jupiter::Database::append(const char *file, Jupiter::DataBuffer &data)
{
	FILE *f = fopen(file, "ab");
	if (f == nullptr)
		return false;
	bool r = Jupiter::Database::append(f, data);
	fclose(f);
	return r;
}